

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token.cc
# Opt level: O0

int TRUST_TOKEN_CLIENT_begin_redemption
              (TRUST_TOKEN_CLIENT *ctx,uint8_t **out,size_t *out_len,TRUST_TOKEN *token,
              uint8_t *data,size_t data_len,uint64_t time)

{
  int iVar1;
  undefined1 local_d0 [8];
  CBB inner;
  CBB token_inner;
  CBB request;
  size_t data_len_local;
  uint8_t *data_local;
  TRUST_TOKEN *token_local;
  size_t *out_len_local;
  uint8_t **out_local;
  TRUST_TOKEN_CLIENT *ctx_local;
  
  iVar1 = CBB_init((CBB *)((long)&token_inner.u + 0x18),0);
  if ((((iVar1 != 0) &&
       (iVar1 = CBB_add_u16_length_prefixed
                          ((CBB *)((long)&token_inner.u + 0x18),(CBB *)((long)&inner.u + 0x18)),
       iVar1 != 0)) &&
      (iVar1 = CBB_add_bytes((CBB *)((long)&inner.u + 0x18),token->data,token->len), iVar1 != 0)) &&
     ((((iVar1 = CBB_add_u16_length_prefixed((CBB *)((long)&token_inner.u + 0x18),(CBB *)local_d0),
        iVar1 != 0 && (iVar1 = CBB_add_bytes((CBB *)local_d0,data,data_len), iVar1 != 0)) &&
       ((ctx->method->has_srr == 0 ||
        (iVar1 = CBB_add_u64((CBB *)((long)&token_inner.u + 0x18),time), iVar1 != 0)))) &&
      (iVar1 = CBB_finish((CBB *)((long)&token_inner.u + 0x18),out,out_len), iVar1 != 0)))) {
    return 1;
  }
  CBB_cleanup((CBB *)((long)&token_inner.u + 0x18));
  return 0;
}

Assistant:

int TRUST_TOKEN_CLIENT_begin_redemption(TRUST_TOKEN_CLIENT *ctx, uint8_t **out,
                                        size_t *out_len,
                                        const TRUST_TOKEN *token,
                                        const uint8_t *data, size_t data_len,
                                        uint64_t time) {
  CBB request, token_inner, inner;
  if (!CBB_init(&request, 0) ||
      !CBB_add_u16_length_prefixed(&request, &token_inner) ||
      !CBB_add_bytes(&token_inner, token->data, token->len) ||
      !CBB_add_u16_length_prefixed(&request, &inner) ||
      !CBB_add_bytes(&inner, data, data_len) ||
      (ctx->method->has_srr && !CBB_add_u64(&request, time)) ||
      !CBB_finish(&request, out, out_len)) {
    CBB_cleanup(&request);
    return 0;
  }
  return 1;
}